

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::set_all
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *c)

{
  color_quad<unsigned_char,_int> *pcVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < this->m_total; uVar2 = uVar2 + 1) {
    pcVar1 = this->m_pPixels;
    pcVar1[uVar2].field_0.field_0.r = (c->field_0).field_0.r;
    pcVar1[uVar2].field_0.field_0.g = (c->field_0).field_0.g;
    pcVar1[uVar2].field_0.field_0.b = (c->field_0).field_0.b;
    pcVar1[uVar2].field_0.field_0.a = (c->field_0).field_0.a;
  }
  return;
}

Assistant:

void set_all(const color_type& c)
        {
            for (uint i = 0; i < m_total; i++)
            {
                m_pPixels[i] = c;
            }
        }